

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O3

int nlalsm(double *vec,int N,int p,int delta,int q,double *phi,double *theta,int M,double *thetac,
          double *var,double eps,double *varcovar,double *residuals)

{
  size_t sVar1;
  long lVar2;
  size_t __n;
  double dVar3;
  ulong uVar4;
  uint uVar5;
  int i;
  uint uVar6;
  int iVar7;
  uint uVar8;
  double *oup;
  void *__dest;
  double *w;
  long lVar9;
  double *phi_00;
  double *theta_00;
  double *phi_01;
  double *theta_01;
  ulong uVar10;
  double *__src;
  double *a;
  double *a_00;
  double *a_01;
  void *__dest_00;
  void *__ptr;
  double *A;
  void *__dest_01;
  double *b;
  double *array;
  double *x;
  double *__src_00;
  int *ipiv;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int N_00;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  size_t __n_00;
  size_t sVar25;
  void *pvVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double sos;
  double local_190;
  long local_140;
  int local_f4;
  double local_b8;
  double local_48;
  int tval;
  
  uVar13 = (ulong)(uint)N;
  if (eps < 0.0) {
    dVar27 = sqrt(eps);
  }
  else {
    dVar27 = SQRT(eps);
  }
  uVar6 = q + p * 0x14;
  uVar15 = 0xf;
  if (0xf < (int)uVar6) {
    uVar15 = (ulong)uVar6;
  }
  sVar25 = (long)(N - delta) << 3;
  oup = (double *)malloc(sVar25);
  __dest = malloc(sVar25);
  w = (double *)malloc(sVar25);
  lVar9 = (long)p;
  phi_00 = (double *)malloc(lVar9 * 8);
  theta_00 = (double *)malloc((long)q << 3);
  phi_01 = (double *)malloc(lVar9 * 8);
  theta_01 = (double *)malloc((long)q << 3);
  if (delta < 1) {
    if (0 < N) {
      sVar25 = uVar13 << 3;
      memcpy(oup,vec,sVar25);
      goto LAB_00135672;
    }
  }
  else {
    uVar6 = diff(vec,N,delta,oup);
    uVar13 = (ulong)uVar6;
    if (0 < (int)uVar6) {
      sVar25 = (ulong)uVar6 << 3;
      vec = oup;
LAB_00135672:
      memcpy(__dest,vec,sVar25);
    }
  }
  uVar17 = q + p;
  N_00 = (int)uVar13;
  USPE(oup,N_00,p,q,phi,theta,thetac,var);
  local_140 = 0;
  uVar6 = uVar17;
  if (M == 1) {
    if (0 < N_00) {
      dVar29 = *thetac;
      uVar10 = 0;
      do {
        oup[uVar10] = oup[uVar10] - dVar29;
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
    }
    uVar6 = uVar17 + 1;
    local_140 = 1;
  }
  uVar10 = (ulong)(int)uVar6;
  sVar1 = uVar10 * 8;
  __src = (double *)malloc(sVar1);
  tval = (int)uVar15;
  iVar7 = tval + N_00;
  sVar25 = (long)iVar7 * 8 - 8;
  uVar18 = (long)iVar7 - 1;
  a = (double *)malloc(sVar25);
  a_00 = (double *)malloc(sVar25);
  a_01 = (double *)malloc(sVar25);
  __dest_00 = malloc(sVar25);
  __ptr = malloc(sVar1 * uVar18);
  A = (double *)malloc(sVar1 * uVar10);
  __dest_01 = malloc(sVar1 * uVar10);
  b = (double *)malloc(sVar1);
  array = (double *)malloc(sVar1);
  x = (double *)malloc(sVar1);
  __src_00 = (double *)malloc(sVar1);
  ipiv = (int *)malloc(uVar10 * 4);
  if (M == 1) {
    *__src = *thetac;
  }
  uVar22 = (ulong)(uint)p;
  if (0 < p) {
    memcpy(__src + local_140,phi,uVar22 * 8);
  }
  uVar4 = (ulong)(uint)q;
  if (0 < q) {
    uVar16 = 0;
    do {
      __src[(long)(p + (int)local_140) + uVar16] = theta[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar4 != uVar16);
  }
  avaluem(oup,N_00,p,q,phi,theta,tval,a);
  if (1 < iVar7) {
    memcpy(__dest_00,a,(uVar18 & 0xffffffff) << 3);
  }
  iVar14 = (int)uVar18;
  if (0 < (int)uVar6) {
    uVar16 = 1;
    if (1 < iVar14) {
      uVar16 = uVar18 & 0xffffffff;
    }
    lVar2 = uVar18 * 8;
    uVar20 = 0;
    pvVar26 = __ptr;
    do {
      dVar29 = __src[uVar20];
      dVar28 = dVar27 * dVar29 + dVar29;
      __src[uVar20] = dVar28;
      if (M == 1) {
        if (0 < p) {
          memcpy(phi_00,__src + 1,uVar22 * 8);
        }
        if (0 < q) {
          uVar11 = 0;
          do {
            theta_00[uVar11] = __src[lVar9 + uVar11 + 1];
            uVar11 = uVar11 + 1;
          } while (uVar4 != uVar11);
        }
        if (0 < N_00) {
          dVar30 = *__src;
          uVar11 = 0;
          do {
            w[uVar11] = *(double *)((long)__dest + uVar11 * 8) - dVar30;
            uVar11 = uVar11 + 1;
          } while (uVar13 != uVar11);
        }
      }
      else {
        if (0 < p) {
          memcpy(phi_00,__src,uVar22 * 8);
        }
        if (0 < q) {
          memcpy(theta_00,__src + lVar9,uVar4 * 8);
        }
        if (0 < N_00) {
          memcpy(w,oup,uVar13 * 8);
        }
      }
      avaluem(w,N_00,p,q,phi_00,theta_00,tval,a_00);
      if (1 < iVar7) {
        uVar11 = 0;
        do {
          *(double *)((long)pvVar26 + uVar11 * 8) = (a[uVar11] - a_00[uVar11]) / (dVar28 - dVar29);
          uVar11 = uVar11 + 1;
        } while (uVar16 != uVar11);
      }
      __src[uVar20] = dVar28 - (dVar28 - dVar29);
      uVar20 = uVar20 + 1;
      pvVar26 = (void *)((long)pvVar26 + lVar2);
    } while (uVar20 != uVar10);
    if (0 < (int)uVar6) {
      uVar16 = 1;
      if (1 < iVar14) {
        uVar16 = uVar18 & 0xffffffff;
      }
      uVar20 = 0;
      pvVar26 = __ptr;
      do {
        uVar11 = 0;
        pvVar19 = __ptr;
        do {
          A[uVar20 * uVar10 + uVar11] = 0.0;
          if (1 < iVar7) {
            dVar29 = 0.0;
            uVar23 = 0;
            do {
              dVar29 = dVar29 + *(double *)((long)pvVar26 + uVar23 * 8) *
                                *(double *)((long)pvVar19 + uVar23 * 8);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
            A[uVar20 * uVar10 + uVar11] = dVar29;
          }
          uVar11 = uVar11 + 1;
          pvVar19 = (void *)((long)pvVar19 + lVar2);
        } while (uVar11 != uVar10);
        uVar20 = uVar20 + 1;
        pvVar26 = (void *)((long)pvVar26 + lVar2);
      } while (uVar20 != uVar10);
      if (0 < (int)uVar6) {
        uVar16 = 1;
        if (1 < iVar14) {
          uVar16 = uVar18 & 0xffffffff;
        }
        uVar20 = 0;
        pvVar26 = __ptr;
        do {
          b[uVar20] = 0.0;
          if (1 < iVar7) {
            dVar29 = 0.0;
            uVar11 = 0;
            do {
              dVar29 = dVar29 + *(double *)((long)pvVar26 + uVar11 * 8) * a[uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar16 != uVar11);
            b[uVar20] = dVar29;
          }
          dVar29 = A[(int)((uVar6 + 1) * (int)uVar20)];
          if (dVar29 < 0.0) {
            dVar29 = sqrt(dVar29);
          }
          else {
            dVar29 = SQRT(dVar29);
          }
          array[uVar20] = dVar29;
          uVar20 = uVar20 + 1;
          pvVar26 = (void *)((long)pvVar26 + lVar2);
          uVar11 = uVar10;
        } while (uVar20 != uVar10);
        goto LAB_00135d3c;
      }
    }
  }
  uVar16 = 1;
  uVar11 = (ulong)uVar6;
  if (1 < iVar14) {
    uVar16 = uVar18 & 0xffffffff;
  }
LAB_00135d3c:
  local_f4 = uVar6 + 1;
  array_max(array,uVar6);
  iVar24 = uVar6 * uVar6;
  __n_00 = (ulong)(iVar24 + (uint)(iVar24 == 0)) << 3;
  sVar25 = uVar22 * 8;
  sVar1 = uVar4 * 8;
  __n = uVar13 * 8;
  local_b8 = 0.01;
  local_48 = 2.0;
  lVar2 = uVar18 * 8;
  uVar5 = 0;
  do {
    uVar8 = uVar5;
    if (0 < (int)uVar6) {
      uVar20 = 0;
      pdVar12 = A;
      do {
        uVar23 = 0;
        do {
          if (uVar8 == 0) {
            pdVar12[uVar23] = pdVar12[uVar23] / (array[uVar20] * array[uVar23]);
          }
          if (uVar20 == uVar23) {
            A[uVar20 + uVar20 * uVar11] = local_b8 + 1.0;
          }
          uVar23 = uVar23 + 1;
        } while (uVar11 != uVar23);
        uVar20 = uVar20 + 1;
        pdVar12 = pdVar12 + uVar11;
      } while (uVar20 != uVar11);
      if ((uVar8 == 0) && (0 < (int)uVar6)) {
        uVar20 = 0;
        do {
          b[uVar20] = b[uVar20] / array[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
    }
    if (uVar6 == 0) {
      ludecomp(A,0,ipiv);
      linsolve(A,0,b,ipiv,x);
    }
    else {
      memcpy(__dest_01,A,__n_00);
      ludecomp(A,uVar6,ipiv);
      linsolve(A,uVar6,b,ipiv,x);
      memcpy(A,__dest_01,__n_00);
      if (0 < (int)uVar6) {
        uVar20 = 0;
        do {
          dVar29 = x[uVar20];
          dVar28 = array[uVar20];
          x[uVar20] = dVar29 / dVar28;
          __src_00[uVar20] = dVar29 / dVar28 + __src[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
    }
    if (M == 1) {
      if (0 < p) {
        memcpy(phi_01,__src_00 + 1,sVar25);
      }
      if (0 < q) {
        uVar20 = 0;
        do {
          theta_01[uVar20] = __src_00[(long)(p + 1) + uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar4 != uVar20);
      }
      if (0 < N_00) {
        dVar29 = *__src_00;
        uVar20 = 0;
        do {
          w[uVar20] = *(double *)((long)__dest + uVar20 * 8) - dVar29;
          uVar20 = uVar20 + 1;
        } while (uVar13 != uVar20);
      }
    }
    else {
      if (0 < p) {
        memcpy(phi_01,__src_00,sVar25);
      }
      if (0 < q) {
        memcpy(theta_01,__src_00 + lVar9,sVar1);
      }
      if (0 < N_00) {
        memcpy(w,oup,__n);
      }
    }
    avaluem(w,N_00,p,q,phi_01,theta_01,tval,a_01);
    if (iVar7 < 2) {
      local_190 = array_max_abs(x,uVar6);
      dVar29 = 0.0;
LAB_0013628a:
      local_b8 = local_b8 * local_48;
      local_48 = local_48 + local_48;
    }
    else {
      memcpy(__dest_00,a_01,uVar16 * 8);
      dVar28 = 0.0;
      uVar20 = 0;
      do {
        dVar28 = dVar28 + a_01[uVar20] * a_01[uVar20];
        uVar20 = uVar20 + 1;
      } while ((uVar18 & 0xffffffff) != uVar20);
      dVar29 = 0.0;
      uVar20 = 0;
      do {
        dVar29 = dVar29 + a[uVar20] * a[uVar20];
        uVar20 = uVar20 + 1;
      } while ((uVar18 & 0xffffffff) != uVar20);
      local_190 = array_max_abs(x,uVar6);
      if (dVar29 <= dVar28) goto LAB_0013628a;
      if (local_190 < 1e-08) {
LAB_001367a5:
        *var = dVar29 / (double)(int)(N_00 - (uVar17 + (int)local_140));
        dVar27 = 0.0;
        if (M == 1) {
          if (0 < p) {
            uVar13 = 0;
            do {
              dVar27 = dVar27 + phi_01[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar22 != uVar13);
          }
          dVar27 = (1.0 - dVar27) * *__src;
        }
        *thetac = dVar27;
        if (0 < p) {
          memcpy(phi,phi_01,sVar25);
        }
        if (0 < q) {
          memcpy(theta,theta_01,sVar1);
        }
        if (0 < (int)uVar6) {
          uVar13 = 0;
          pvVar26 = __ptr;
          do {
            uVar18 = 0;
            pvVar19 = __ptr;
            do {
              A[uVar13 * uVar10 + uVar18] = 0.0;
              if (1 < iVar7) {
                dVar27 = 0.0;
                uVar22 = 0;
                do {
                  dVar27 = dVar27 + *(double *)((long)pvVar26 + uVar22 * 8) *
                                    *(double *)((long)pvVar19 + uVar22 * 8);
                  uVar22 = uVar22 + 1;
                } while (uVar16 != uVar22);
                A[uVar13 * uVar10 + uVar18] = dVar27;
              }
              uVar18 = uVar18 + 1;
              pvVar19 = (void *)((long)pvVar19 + lVar2);
            } while (uVar18 != uVar11);
            uVar13 = uVar13 + 1;
            pvVar26 = (void *)((long)pvVar26 + lVar2);
          } while (uVar13 != uVar11);
        }
        ludecomp(A,uVar6,ipiv);
        minverse(A,uVar6,ipiv,varcovar);
        if (uVar6 != 0) {
          uVar13 = 0;
          do {
            varcovar[uVar13] = varcovar[uVar13] * *var;
            uVar13 = uVar13 + 1;
          } while (iVar24 + (uint)(iVar24 == 0) != uVar13);
        }
        if (0 < N_00) {
          memcpy(residuals,(void *)((long)__dest_00 + uVar15 * 8 + -8),
                 (ulong)(uint)(iVar14 - tval) * 8 + 8);
        }
        free(oup);
        free(w);
        free(phi_00);
        free(theta_00);
        free(__src);
        free(a);
        free(a_00);
        free(__ptr);
        free(A);
        free(b);
        free(array);
        free(x);
        free(__src_00);
        free(ipiv);
        free(phi_01);
        free(theta_01);
        free(a_01);
        free(__dest_00);
        free(__dest);
        free(__dest_01);
        return (uint)(0xc6 < uVar8) * 3 + 1;
      }
      if (0 < (int)uVar6) {
        memcpy(__src,__src_00,uVar11 * 8);
      }
      if (M == 1) {
        if (0 < N_00) {
          dVar28 = *__src;
          uVar20 = 0;
          do {
            w[uVar20] = *(double *)((long)__dest + uVar20 * 8) - dVar28;
            uVar20 = uVar20 + 1;
          } while (uVar13 != uVar20);
        }
      }
      else if (0 < N_00) {
        memcpy(w,oup,__n);
      }
      local_b8 = local_b8 / local_48;
      avaluem(w,N_00,p,q,phi_01,theta_01,tval,a);
      memcpy(__dest_00,a,uVar16 * 8);
      if ((int)uVar6 < 1) {
        local_48 = 2.0;
      }
      else {
        uVar20 = 0;
        pvVar26 = __ptr;
        do {
          dVar28 = __src[uVar20];
          dVar30 = dVar27 * dVar28 + dVar28;
          __src[uVar20] = dVar30;
          if (M == 1) {
            if (0 < p) {
              memcpy(phi_00,__src + 1,sVar25);
            }
            if (0 < q) {
              uVar23 = 0;
              do {
                theta_00[uVar23] = __src[(long)(p + 1) + uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar4 != uVar23);
            }
            if (0 < N_00) {
              dVar3 = *__src;
              uVar23 = 0;
              do {
                w[uVar23] = *(double *)((long)__dest + uVar23 * 8) - dVar3;
                uVar23 = uVar23 + 1;
              } while (uVar13 != uVar23);
            }
          }
          else {
            if (0 < p) {
              memcpy(phi_00,__src,sVar25);
            }
            if (0 < q) {
              memcpy(theta_00,__src + lVar9,sVar1);
            }
            if (0 < N_00) {
              memcpy(w,oup,__n);
            }
          }
          avaluem(w,N_00,p,q,phi_00,theta_00,tval,a_00);
          uVar23 = 0;
          do {
            *(double *)((long)pvVar26 + uVar23 * 8) = (a[uVar23] - a_00[uVar23]) / (dVar30 - dVar28)
            ;
            uVar23 = uVar23 + 1;
          } while (uVar16 != uVar23);
          __src[uVar20] = dVar30 - (dVar30 - dVar28);
          uVar20 = uVar20 + 1;
          pvVar26 = (void *)((long)pvVar26 + lVar2);
        } while (uVar20 != uVar11);
        if ((int)uVar6 < 1) {
LAB_00136799:
          local_48 = 2.0;
        }
        else {
          uVar20 = 0;
          pvVar26 = __ptr;
          do {
            uVar23 = 0;
            pvVar19 = __ptr;
            do {
              dVar28 = 0.0;
              uVar21 = 0;
              do {
                dVar28 = dVar28 + *(double *)((long)pvVar26 + uVar21 * 8) *
                                  *(double *)((long)pvVar19 + uVar21 * 8);
                uVar21 = uVar21 + 1;
              } while (uVar16 != uVar21);
              A[uVar20 * uVar10 + uVar23] = dVar28;
              uVar23 = uVar23 + 1;
              pvVar19 = (void *)((long)pvVar19 + lVar2);
            } while (uVar23 != uVar11);
            uVar20 = uVar20 + 1;
            pvVar26 = (void *)((long)pvVar26 + lVar2);
          } while (uVar20 != uVar11);
          if ((int)uVar6 < 1) {
            local_48 = 2.0;
          }
          else {
            uVar20 = 0;
            pvVar26 = __ptr;
            do {
              dVar28 = 0.0;
              uVar23 = 0;
              do {
                dVar28 = dVar28 + *(double *)((long)pvVar26 + uVar23 * 8) * a[uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar16 != uVar23);
              b[uVar20] = dVar28;
              dVar28 = A[local_f4 * (int)uVar20];
              if (dVar28 < 0.0) {
                dVar28 = sqrt(dVar28);
              }
              else {
                dVar28 = SQRT(dVar28);
              }
              array[uVar20] = dVar28;
              uVar20 = uVar20 + 1;
              pvVar26 = (void *)((long)pvVar26 + lVar2);
            } while (uVar20 != uVar11);
            if ((int)uVar6 < 1) goto LAB_00136799;
            uVar20 = 0;
            pdVar12 = A;
            do {
              dVar28 = array[uVar20];
              uVar23 = 0;
              do {
                dVar30 = local_b8 + 1.0;
                if (uVar20 != uVar23) {
                  dVar30 = pdVar12[uVar23] / (array[uVar23] * dVar28);
                }
                pdVar12[uVar23] = dVar30;
                uVar23 = uVar23 + 1;
              } while (uVar11 != uVar23);
              uVar20 = uVar20 + 1;
              pdVar12 = pdVar12 + uVar11;
            } while (uVar20 != uVar11);
            if (0 < (int)uVar6) {
              uVar20 = 0;
              do {
                b[uVar20] = b[uVar20] / array[uVar20];
                uVar20 = uVar20 + 1;
              } while (uVar11 != uVar20);
            }
            local_48 = 2.0;
          }
        }
      }
    }
    if ((local_190 < 1e-08) || (uVar5 = uVar8 + 1, 0xc6 < uVar8)) goto LAB_001367a5;
  } while( true );
}

Assistant:

int nlalsm(double *vec,int N,int p,int delta, int q, double *phi,double *theta,
		int M,double *thetac,double *var,double eps,double *varcovar,double *residuals) {
	int retval,i,j,l,k,t,t2,it,Norig,qd,itmax;
	double lam,vmul,e1,di,eps2,stepsize,temp,tau,hmax,suminc,sumb;
	double *inp,*b,*at,*at0,*x,*phi0,*theta0,*orig,*A,*g,*D,*h,*binc,*Atemp;
	double *phiinc,*thetainc,*atinc,*resat,*origval;
	int *ipiv;


	eps2 = sqrt(eps);
	lam = 0.01;
	vmul = 2.0;
	e1 = 1.0e-08;
	it = 0;
	Norig = N;
	k = p + q;
	di = eps2;//0.001;//eps2;//0.001
	qd = q + 20 * p;

	if (qd < 15) {
		qd = 15;
	}
	hmax = 1;
	itmax = 200;

	inp = (double*) malloc(sizeof(double) * (N - delta));
	origval = (double*) malloc(sizeof(double) * (N - delta));
	orig = (double*) malloc(sizeof(double) * (N - delta));
	phi0 = (double*) malloc(sizeof(double) * p);
	theta0 = (double*) malloc(sizeof(double) * q);
	phiinc = (double*) malloc(sizeof(double) * p);
	thetainc = (double*) malloc(sizeof(double) * q);
	
	if (delta > 0) {
		N = diff(vec,Norig,delta,inp);
		for (i = 0; i < N;++i) {
			origval[i] = inp[i];
		}
	} else {
		for(i = 0; i < N;++i) {
			inp[i] = vec[i];
			origval[i] = inp[i];
		}
	}
	

	USPE(inp,N,p,q,phi,theta,thetac,var); // Initial Parameters

	if (M == 1) {
		for(i = 0; i < N;++i) {
			inp[i] -= *thetac;
		}
		M = 1;
		k++;
	} else {
		M = 0;
	}
	
	b = (double*) malloc(sizeof(double) * k);
	at = (double*) malloc(sizeof(double) * (N+qd-1));
	at0 = (double*) malloc(sizeof(double) * (N+qd-1));
	atinc = (double*) malloc(sizeof(double) * (N+qd-1));
	resat = (double*) malloc(sizeof(double) * (N+qd-1));
	x = (double*) malloc(sizeof(double) * k * (N+qd-1));
	A = (double*) malloc(sizeof(double) * k * k);
	Atemp = (double*) malloc(sizeof(double) * k * k);
	g = (double*) malloc(sizeof(double) * k);
	D = (double*) malloc(sizeof(double) * k);
	h = (double*) malloc(sizeof(double) * k);
	binc = (double*) malloc(sizeof(double) * k);
	ipiv = (int*) malloc(sizeof(int) * k);
	
	if (M == 1) {
		b[0] = *thetac;
	}
	
	for(i = 0; i < p;++i) {
		b[M+i] = phi[i];
	}
	
	for(i = 0; i < q;++i) {
		b[M+p+i] = theta[i];
	}
	
	//mdisplay(b,1,k);

    avaluem(inp,N,p,q,phi,theta,qd,at);
	
	for(i = 0; i < N+qd-1;++i) {
		resat[i] = at[i];
	}
	//mdisplay(at,1,N+qd-1);
	for(i = 0; i < k;++i) {
		stepsize = b[i]*di;//di;//b[i] * di;
		temp = b[i];
		b[i] += stepsize;
		stepsize = b[i] - temp;
		if (M == 1) {
			for(j = 0;j < p;++j) {
				phi0[j] = b[1+j];
			}
			for(j = 0; j < q;++j) {
				theta0[j] = b[p+1+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = origval[j] - b[0];
			}
		} else {
			for(j = 0;j < p;++j) {
				phi0[j] = b[j];
			}
			for(j = 0; j < q;++j) {
				theta0[j] = b[p+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = inp[j];
			}
		}
	    avaluem(orig,N,p,q,phi0,theta0,qd,at0);	
	    //mdisplay(inp,1,N);

		t = i * (N + qd - 1);
		
		for(j = 0; j < N + qd - 1;++j) {
			x[t+j] = (at[j] - at0[j]) / stepsize;
		}
		
		b[i] -= stepsize;
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		for(j = 0; j < k;++j) {
			t2 = j * (N + qd - 1);
			A[i*k+j] = 0.0;
			for(l = 0; l < N + qd -1;++l) {
				A[i*k+j] += x[t+l] * x[t2+l];
			}

		}
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		g[i] = 0.0;
		for(l = 0; l < N + qd - 1;++l) {
			g[i] += x[t+l] * at[l];
		}
		D[i] = sqrt(A[i*k+i]);
	}

	tau = array_max(D,k);
	//printf("TAU %g \n",tau);
	//mdisplay(x,k,N+qd-1);

	while (hmax >= e1 && it < itmax) {
		it++;
		for(i = 0; i < k;++i) {
			for(j = 0; j < k;++j) {
				if (it == 1) {
					A[i*k+j] = A[i*k+j] / (D[i] * D[j]);
				}
				if (i == j) {
					A[i*k+j] = 1.0 + lam;
				}
			}
		}

		if (it == 1) {
			for(i = 0; i < k; ++i) {
				g[i] = g[i] / D[i];
			}
		}

		for(i = 0; i < k*k;++i) {
			Atemp[i] = A[i];
		}
		ludecomp(A,k,ipiv);
		linsolve(A,k,g,ipiv,h);
		for(i = 0; i < k*k;++i) {
			A[i] = Atemp[i];
		}

		for(j = 0; j < k;++j) {
			h[j] = h[j] / D[j];
			binc[j] = b[j] + h[j];
		}

		if (M == 1) {
			for(j = 0;j < p;++j) {
				phiinc[j] = binc[1+j];
			}
			for(j = 0; j < q;++j) {
				thetainc[j] = binc[p+1+j];
			}

			for(j = 0; j < N;++j) {
				orig[j] = origval[j] - binc[0];
			}
		} else {
			for(j = 0;j < p;++j) {
				phiinc[j] = binc[j];
			}
			for(j = 0; j < q;++j) {
				thetainc[j] = binc[p+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = inp[j];
			}
		}

	    avaluem(orig,N,p,q,phiinc,thetainc,qd,atinc);
	    for(i = 0; i < N+qd-1;++i) {
	    	resat[i] = atinc[i];
	    }

	    suminc = sosqm(atinc,N+qd-1);
	    sumb = sosqm(at,N+qd-1);

	    hmax = array_max_abs(h,k);
	    //printf("HMAX %g %g %g \n",hmax,suminc,sumb);

	    if (suminc < sumb) {
	    	if (hmax < e1) {
	    		retval = 1;
	    		break;
	    	} else {
	    		for(i = 0; i < k;++i) {
	    			b[i] = binc[i];
	    		}
	    		lam = lam / vmul;
	    		vmul = 2.0;
				if (M == 1) {
					for(j = 0; j < N;++j) {
						orig[j] = origval[j] - b[0];
					}
				} else {
					for(j = 0; j < N;++j) {
						orig[j] = inp[j];
					}				
				}
			    avaluem(orig,N,p,q,phiinc,thetainc,qd,at);
			    for(i = 0; i < N+qd-1;++i) {
			    	resat[i] = at[i];
			    }
				
				for(i = 0; i < k;++i) {
					stepsize = b[i]*di;//di;//b[i] * di;
					temp = b[i];
					b[i] += stepsize;
					stepsize = b[i] - temp;
		
					if (M == 1) {
						for(j = 0;j < p;++j) {
							phi0[j] = b[1+j];
						}
						for(j = 0; j < q;++j) {
							theta0[j] = b[p+1+j];
						}

						for(j = 0; j < N;++j) {
							orig[j] = origval[j] - b[0];
						}

					} else {
						for(j = 0;j < p;++j) {
							phi0[j] = b[j];
						}
						for(j = 0; j < q;++j) {
							theta0[j] = b[p+j];
						}
						for(j = 0; j < N;++j) {
							orig[j] = inp[j];
						}
					}
				    avaluem(orig,N,p,q,phi0,theta0,qd,at0);	
					t = i * (N + qd - 1);
		
					for(j = 0; j < N + qd - 1;++j) {
						x[t+j] = (at[j] - at0[j]) / stepsize;
					}
		
					b[i] -= stepsize;
				}
				for(i = 0; i < k;++i) {
					t = i * (N + qd - 1);
					for(j = 0; j < k;++j) {
						t2 = j * (N + qd - 1);
						A[i*k+j] = 0.0;
						for(l = 0; l < N + qd -1;++l) {
							A[i*k+j] += x[t+l] * x[t2+l];
						}

					}
				}

				for(i = 0; i < k;++i) {
					t = i * (N + qd - 1);
					g[i] = 0.0;
					for(l = 0; l < N + qd - 1;++l) {
						g[i] += x[t+l] * at[l];
					}
					D[i] = sqrt(A[i*k+i]);
				}
				
				for(i = 0; i < k;++i) {
					for(j = 0; j < k;++j) {
						A[i*k+j] = A[i*k+j] / (D[i] * D[j]);
						if (i == j) {
							A[i*k+j] = 1.0 + lam;
						}
					}
				}

				for(i = 0; i < k; ++i) {
					g[i] = g[i] / D[i];
				}

	    	}
	    } else {
			lam=lam*vmul;
			vmul=2.0*vmul;
	    }

	}
	
	//printf("Iterations %d \n",it);
	
	if (it >= itmax) {
		retval = 4;
	} else if (it < itmax && it > 0) {
		retval = 1;
	}
	// Residual Variance
	*var = sumb * 1.0 /(N - p - q - M);
	//Constant Term
	if (M == 1) {
		temp = 0.0;
		for (i = 0;i < p;++i) {
			temp += phiinc[i];
		}
		*thetac = b[0] * (1.0 - temp);
	} else {
		*thetac = 0.0;
	}
	// Parameters Phi and Theta
	
	for (i = 0; i < p;++i) {
		phi[i] = phiinc[i];
	}
	for (i = 0; i < q;++i) {
		theta[i] = thetainc[i];
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		for(j = 0; j < k;++j) {
			t2 = j * (N + qd - 1);
			A[i*k+j] = 0.0;
			for(l = 0; l < N + qd -1;++l) {
				A[i*k+j] += x[t+l] * x[t2+l];
			}

		}
	}

	ludecomp(A,k,ipiv);
	minverse(A,k,ipiv,varcovar);

	//mdisplay(varcovar, 1, k*k);

	for(i = 0; i < k*k;++i) {
		varcovar[i] = varcovar[i] * (*var);
	}

	for(i = qd-1; i < N+qd-1;++i) {
		residuals[i-qd+1] = resat[i];
	}


	free(inp);
	free(orig);
	free(phi0);
	free(theta0);
	free(b);
	free(at);
	free(at0);
	free(x);
	free(A);
	free(g);
	free(D);
	free(h);
	free(binc);
	free(ipiv);
	free(phiinc);
	free(thetainc);
	free(atinc);
	free(resat);
	free(origval);
	free(Atemp);
	return retval;
}